

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RayTracerConfig.cpp
# Opt level: O3

ostream * operator<<(ostream *out,RayTracerConfig *config)

{
  pointer pSVar1;
  pointer pPVar2;
  pointer pTVar3;
  undefined8 in_RAX;
  ostream *poVar4;
  Sphere *sphere;
  pointer sphere_00;
  pointer plane;
  pointer triangle;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  std::__ostream_insert<char,std::char_traits<char>>(out,"antiAliasing: ",0xe);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)out,(config->super_BaseConfig).antiAliasing);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nmaxRecursionLevel: ",0x14);
  poVar4 = (ostream *)
           std::ostream::operator<<((ostream *)poVar4,(config->super_BaseConfig).maxRecursionLevel);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nambientCoefficient: ",0x15);
  poVar4 = std::ostream::_M_insert<double>((double)(config->super_BaseConfig).ambientCoefficient);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nimageX: ",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(config->super_BaseConfig).imageX);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nimageY: ",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(config->super_BaseConfig).imageY);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nimageZ: ",9);
  poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,(config->super_BaseConfig).imageZ);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nobserver: ",0xb);
  poVar4 = operator<<(poVar4,&(config->super_BaseConfig).observer);
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nlight: ",8);
  operator<<(poVar4,&(config->super_BaseConfig).light);
  std::__ostream_insert<char,std::char_traits<char>>(out,"\nspheres:\n",10);
  sphere_00 = (config->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
              super__Vector_impl_data._M_start;
  pSVar1 = (config->spheres).super__Vector_base<Sphere,_std::allocator<Sphere>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (sphere_00 != pSVar1) {
    do {
      poVar4 = operator<<(out,sphere_00);
      uStack_38 = CONCAT17(10,(undefined7)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 7),1);
      sphere_00 = sphere_00 + 1;
    } while (sphere_00 != pSVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"planes:\n",8);
  plane = (config->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
          super__Vector_impl_data._M_start;
  pPVar2 = (config->planes).super__Vector_base<Plane,_std::allocator<Plane>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (plane != pPVar2) {
    do {
      poVar4 = operator<<(out,plane);
      uStack_38._0_7_ = CONCAT16(10,(undefined6)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 6),1);
      plane = plane + 1;
    } while (plane != pPVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(out,"planes:\n",8);
  triangle = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
             super__Vector_impl_data._M_start;
  pTVar3 = (config->triangles).super__Vector_base<Triangle,_std::allocator<Triangle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (triangle != pTVar3) {
    do {
      poVar4 = operator<<(out,triangle);
      uStack_38._0_6_ = CONCAT15(10,(undefined5)uStack_38);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)((long)&uStack_38 + 5),1);
      triangle = triangle + 1;
    } while (triangle != pTVar3);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, RayTracerConfig const& config)
{
  out << "antiAliasing: " << config.antiAliasing
      << "\nmaxRecursionLevel: " << config.maxRecursionLevel
      << "\nambientCoefficient: " << config.ambientCoefficient << "\nimageX: " << config.imageX
      << "\nimageY: " << config.imageY << "\nimageZ: " << config.imageZ
      << "\nobserver: " << config.observer << "\nlight: " << config.light;
  out << "\nspheres:\n";
  for (Sphere const& sphere : config.spheres)
    out << sphere << '\n';
  out << "planes:\n";
  for (Plane const& plane : config.planes)
    out << plane << '\n';
  out << "planes:\n";
  for (Triangle const& triangle : config.triangles)
    out << triangle << '\n';
  return out;
}